

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.cpp
# Opt level: O0

string * __thiscall
ArchiveMemberHeader::getName_abi_cxx11_(string *__return_storage_ptr__,ArchiveMemberHeader *this)

{
  ulong uVar1;
  allocator local_29;
  uint8_t *local_28;
  uint8_t *end;
  ArchiveMemberHeader *pAStack_18;
  char endChar;
  ArchiveMemberHeader *this_local;
  
  if (this->fileName[0] == '/') {
    end._7_1_ = ' ';
  }
  else {
    end._7_1_ = '/';
  }
  pAStack_18 = this;
  this_local = (ArchiveMemberHeader *)__return_storage_ptr__;
  local_28 = (uint8_t *)memchr(this,(int)end._7_1_,0x10);
  if (local_28 == (uint8_t *)0x0) {
    local_28 = this->timestamp;
  }
  uVar1 = (long)local_28 - (long)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)this,uVar1,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  return __return_storage_ptr__;
}

Assistant:

std::string ArchiveMemberHeader::getName() const {
  char endChar;
  if (fileName[0] == '/') {
    // Special name (string table or reference, or symbol table)
    endChar = ' ';
  } else {
    endChar = '/'; // regular name
  }
  auto* end =
    static_cast<const uint8_t*>(memchr(fileName, endChar, sizeof(fileName)));
  if (!end) {
    end = fileName + sizeof(fileName);
  }
  return std::string((char*)(fileName), end - fileName);
}